

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSendStringTo(HelicsEndpoint endpoint,char *message,char *dest,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view dest_00;
  data_view local_40;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    this = pEVar1->endPtr;
    local_40.dblock._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    local_40.dblock._M_str = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (message != (char *)0x0) {
      local_40.dblock._M_len = strlen(message);
      local_40.dblock._M_str = message;
    }
    local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_40.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (dest != (char *)0x0) {
      sVar2 = strlen(dest);
      _Var3._M_p = dest;
    }
    dest_00._M_str = _Var3._M_p;
    dest_00._M_len = sVar2;
    helics::Endpoint::sendTo(this,&local_40,dest_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void helicsEndpointSendStringTo(HelicsEndpoint endpoint, const char* message, const char* dest, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendTo(AS_STRING_VIEW(message), AS_STRING_VIEW(dest));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}